

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::init
          (SparseTextureClampLookupResidencyTestCase *this,EVP_PKEY_CTX *ctx)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  int extraout_EAX;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_01;
  FunctionToken f;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  FunctionToken local_1f8;
  FunctionToken local_188;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  local_188.name._M_dataplus._M_p._0_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,(int *)&local_188);
  local_188.name._M_dataplus._M_p = (pointer)&local_188.name.field_2;
  local_188.name._M_string_length = 0;
  local_188.name.field_2._M_local_buf[0] = '\0';
  local_188.arguments._M_dataplus._M_p = (pointer)&local_188.arguments.field_2;
  local_188.arguments._M_string_length = 0;
  local_188.arguments.field_2._M_local_buf[0] = '\0';
  local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_188.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"sparseTextureClampARB",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,", <LOD>",&local_1fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_1f8,&local_38,&local_58);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_188,&local_1f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_1f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = &local_188.allowedTargets;
  local_1f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  this_01 = &(this->super_SparseTexture2LookupTestCase).mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"sparseTextureOffsetClampARB",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_1fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_1f8,&local_78,&local_98);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_188,&local_1f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_1f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"sparseTextureGradClampARB",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_1fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_1f8,&local_b8,&local_d8);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_188,&local_1f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_1f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"sparseTextureGradOffsetClampARB",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_1fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_1f8,&local_f8,&local_118);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_188,&local_1f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_1f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  local_1f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_00->_M_t,(int *)&local_1f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,&local_188);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_188);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}